

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

CURLcode Curl_pp_vsendf(Curl_easy *data,pingpong *pp,char *fmt,__va_list_tag *args)

{
  connectdata *pcVar1;
  char *pcVar2;
  size_t len;
  char *ptr;
  curltime cVar3;
  undefined4 uStack_5c;
  connectdata *conn;
  CURLcode result;
  char *s;
  size_t write_len;
  ssize_t bytes_written;
  __va_list_tag *args_local;
  char *fmt_local;
  pingpong *pp_local;
  Curl_easy *data_local;
  
  write_len = 0;
  pcVar1 = data->conn;
  if (pcVar1 == (connectdata *)0x0) {
    data_local._4_4_ = CURLE_SEND_ERROR;
  }
  else {
    bytes_written = (ssize_t)args;
    args_local = (__va_list_tag *)fmt;
    fmt_local = (char *)pp;
    pp_local = (pingpong *)data;
    Curl_dyn_reset(&pp->sendbuf);
    data_local._4_4_ =
         Curl_dyn_vaddf((dynbuf *)(fmt_local + 0x58),(char *)args_local,
                        (__va_list_tag *)bytes_written);
    if ((data_local._4_4_ == CURLE_OK) &&
       (data_local._4_4_ = Curl_dyn_addn((dynbuf *)(fmt_local + 0x58),"\r\n",2),
       data_local._4_4_ == CURLE_OK)) {
      len = Curl_dyn_len((dynbuf *)(fmt_local + 0x58));
      ptr = Curl_dyn_ptr((dynbuf *)(fmt_local + 0x58));
      Curl_pp_init((Curl_easy *)pp_local,(pingpong *)fmt_local);
      data_local._4_4_ =
           Curl_write((Curl_easy *)pp_local,pcVar1->sock[0],ptr,len,(ssize_t *)&write_len);
      if (data_local._4_4_ == CURLE_OK) {
        Curl_debug((Curl_easy *)pp_local,CURLINFO_HEADER_OUT,ptr,write_len);
        pcVar2 = fmt_local;
        if (write_len == len) {
          fmt_local[0x28] = '\0';
          fmt_local[0x29] = '\0';
          fmt_local[0x2a] = '\0';
          fmt_local[0x2b] = '\0';
          fmt_local[0x2c] = '\0';
          fmt_local[0x2d] = '\0';
          fmt_local[0x2e] = '\0';
          fmt_local[0x2f] = '\0';
          fmt_local[0x38] = '\0';
          fmt_local[0x39] = '\0';
          fmt_local[0x3a] = '\0';
          fmt_local[0x3b] = '\0';
          fmt_local[0x3c] = '\0';
          fmt_local[0x3d] = '\0';
          fmt_local[0x3e] = '\0';
          fmt_local[0x3f] = '\0';
          fmt_local[0x30] = '\0';
          fmt_local[0x31] = '\0';
          fmt_local[0x32] = '\0';
          fmt_local[0x33] = '\0';
          fmt_local[0x34] = '\0';
          fmt_local[0x35] = '\0';
          fmt_local[0x36] = '\0';
          fmt_local[0x37] = '\0';
          cVar3 = Curl_now();
          *(time_t *)(pcVar2 + 0x40) = cVar3.tv_sec;
          *(ulong *)(pcVar2 + 0x48) = CONCAT44(uStack_5c,cVar3.tv_usec);
        }
        else {
          *(char **)(fmt_local + 0x28) = ptr;
          *(size_t *)(fmt_local + 0x38) = len;
          *(size_t *)(fmt_local + 0x30) = len - write_len;
        }
        data_local._4_4_ = CURLE_OK;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_pp_vsendf(struct Curl_easy *data,
                        struct pingpong *pp,
                        const char *fmt,
                        va_list args)
{
  ssize_t bytes_written = 0;
  size_t write_len;
  char *s;
  CURLcode result;
  struct connectdata *conn = data->conn;

#ifdef HAVE_GSSAPI
  enum protection_level data_sec;
#endif

  DEBUGASSERT(pp->sendleft == 0);
  DEBUGASSERT(pp->sendsize == 0);
  DEBUGASSERT(pp->sendthis == NULL);

  if(!conn)
    /* can't send without a connection! */
    return CURLE_SEND_ERROR;

  Curl_dyn_reset(&pp->sendbuf);
  result = Curl_dyn_vaddf(&pp->sendbuf, fmt, args);
  if(result)
    return result;

  /* append CRLF */
  result = Curl_dyn_addn(&pp->sendbuf, "\r\n", 2);
  if(result)
    return result;

  write_len = Curl_dyn_len(&pp->sendbuf);
  s = Curl_dyn_ptr(&pp->sendbuf);
  Curl_pp_init(data, pp);

#ifdef HAVE_GSSAPI
  conn->data_prot = PROT_CMD;
#endif
  result = Curl_write(data, conn->sock[FIRSTSOCKET], s, write_len,
                      &bytes_written);
  if(result)
    return result;
#ifdef HAVE_GSSAPI
  data_sec = conn->data_prot;
  DEBUGASSERT(data_sec > PROT_NONE && data_sec < PROT_LAST);
  conn->data_prot = data_sec;
#endif

  Curl_debug(data, CURLINFO_HEADER_OUT, s, (size_t)bytes_written);

  if(bytes_written != (ssize_t)write_len) {
    /* the whole chunk was not sent, keep it around and adjust sizes */
    pp->sendthis = s;
    pp->sendsize = write_len;
    pp->sendleft = write_len - bytes_written;
  }
  else {
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_now();
  }

  return CURLE_OK;
}